

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::CExpStatement::Copy(CExpStatement *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  _func_int *local_20;
  
  pp_Var1 = (_func_int **)operator_new(0x10);
  (**(code **)(**(long **)(in_RSI + 8) + 0x18))(&local_20);
  *pp_Var1 = (_func_int *)&PTR_Accept_0017aff8;
  pp_Var1[1] = local_20;
  (this->super_CStatement).super_IStatement.super_INode._vptr_INode = pp_Var1;
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CStatement> CExpStatement::Copy( ) const {
    return std::move( std::unique_ptr<const CStatement>( new CExpStatement( expression->Copy( ))));
}